

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O3

u8 __thiscall GB::sub(GB *this,u8 x,u8 c)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  
  bVar1 = (this->s).field_2.field_0.a;
  uVar3 = (uint)bVar1 -
          ((int)CONCAT71(in_register_00000011,c) + (int)CONCAT71(in_register_00000031,x));
  bVar2 = (byte)uVar3;
  (this->s).field_2.field_0.f =
       ((bVar2 != 0) << 7 | (byte)(uVar3 >> 4) & 0x10 | (x ^ bVar1 ^ bVar2) * '\x02' & 0x20) - 0x40;
  return bVar2;
}

Assistant:

u8 GB::sub(u8 x, u8 c) {
  int r = s.a - x - c;
  s.f = zflag(r) | FN | hflag(r, s.a, x) | ((r >> 4) & FC);
  return r;
}